

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytecodeJitX86.c
# Opt level: O0

void sysbvm_jit_sendWithReceiverType
               (sysbvm_bytecodeJit_t *jit,int16_t resultOperand,int16_t receiverTypeOperand,
               int16_t selectorOperand,size_t argumentCount,int16_t *argumentOperands,
               int applicationFlags)

{
  void *value;
  sysbvm_pic_t *pic;
  size_t i;
  int16_t *argumentOperands_local;
  size_t argumentCount_local;
  int16_t selectorOperand_local;
  int16_t receiverTypeOperand_local;
  int16_t resultOperand_local;
  sysbvm_bytecodeJit_t *jit_local;
  
  for (pic = (sysbvm_pic_t *)0x0; pic < (sysbvm_pic_t *)(argumentCount + 1);
      pic = (sysbvm_pic_t *)((long)&pic->preSequence + 1)) {
    sysbvm_jit_moveOperandToCallArgumentVector(jit,argumentOperands[(long)pic],(int32_t)pic);
  }
  sysbvm_jit_x86_jitLoadContextInRegister(jit,SYSBVM_X86_64_ARG0);
  value = sysbvm_chunkedAllocator_allocate(&(jit->context->heap).picTableAllocator,0x68,8);
  sysbvm_jit_x86_mov64Absolute(jit,SYSBVM_X86_64_ARG1,(uint64_t)value);
  sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG2,receiverTypeOperand);
  sysbvm_jit_moveOperandToRegister(jit,SYSBVM_X86_64_ARG3,selectorOperand);
  sysbvm_jit_x86_movImmediate32(jit,SYSBVM_X86_R8,(int32_t)argumentCount);
  sysbvm_jit_x86_leaRegisterWithOffset
            (jit,SYSBVM_X86_R9,SYSBVM_X86_EBP,jit->callArgumentVectorOffset);
  sysbvm_jit_x86_movS32IntoMemoryWithOffset(jit,SYSBVM_X86_ESP,0,applicationFlags);
  sysbvm_jit_x86_call(jit,sysbvm_bytecodeInterpreter_interpretSendWithReceiverTypeNoCopyArguments);
  sysbvm_jit_moveRegisterToOperand(jit,resultOperand,SYSBVM_X86_64_CALL_SHADOW_SPACE);
  return;
}

Assistant:

SYSBVM_API void sysbvm_jit_sendWithReceiverType(sysbvm_bytecodeJit_t *jit, int16_t resultOperand, int16_t receiverTypeOperand, int16_t selectorOperand, size_t argumentCount, int16_t *argumentOperands, int applicationFlags)
{
    // Push all of the arguments in the stack.
    for(size_t i = 0; i < argumentCount + 1; ++i)
        sysbvm_jit_moveOperandToCallArgumentVector(jit, argumentOperands[i], (int32_t)i);

    sysbvm_jit_x86_jitLoadContextInRegister(jit, SYSBVM_X86_64_ARG0);

    sysbvm_pic_t *pic = (sysbvm_pic_t*)sysbvm_chunkedAllocator_allocate(&jit->context->heap.picTableAllocator, sizeof(sysbvm_pic_t), sizeof(uintptr_t));
    sysbvm_jit_x86_mov64Absolute(jit, SYSBVM_X86_64_ARG1, (uint64_t)pic);

    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG2, receiverTypeOperand);

    sysbvm_jit_moveOperandToRegister(jit, SYSBVM_X86_64_ARG3, selectorOperand);
#ifdef _WIN32
    sysbvm_jit_x86_movS32IntoMemoryWithOffset(jit, SYSBVM_X86_RSP, 4*sizeof(void*), (int32_t)argumentCount);

    sysbvm_jit_x86_leaRegisterWithOffset(jit, SYSBVM_X86_RAX, SYSBVM_X86_RBP, jit->callArgumentVectorOffset);
    sysbvm_jit_x86_mov64IntoMemoryWithOffset(jit, SYSBVM_X86_RSP, 5*sizeof(void*), SYSBVM_X86_RAX);

    sysbvm_jit_x86_movS32IntoMemoryWithOffset(jit, SYSBVM_X86_RSP, 6*sizeof(void*), applicationFlags);
#else
    sysbvm_jit_x86_movImmediate32(jit, SYSBVM_X86_SYSV_ARG4, (int32_t)argumentCount);

    sysbvm_jit_x86_leaRegisterWithOffset(jit, SYSBVM_X86_SYSV_ARG5, SYSBVM_X86_RBP, jit->callArgumentVectorOffset);

    sysbvm_jit_x86_movS32IntoMemoryWithOffset(jit, SYSBVM_X86_RSP, 0*sizeof(void*), applicationFlags);
#endif
    sysbvm_jit_x86_call(jit, &sysbvm_bytecodeInterpreter_interpretSendWithReceiverTypeNoCopyArguments);

    sysbvm_jit_moveRegisterToOperand(jit, resultOperand, SYSBVM_X86_RAX);
}